

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O1

void Curl_ssl_scache_destroy(Curl_ssl_scache *scache)

{
  long lVar1;
  ulong uVar2;
  
  if ((scache != (Curl_ssl_scache *)0x0) && (scache->magic == 0xe1551)) {
    scache->magic = 0;
    if (scache->peer_count != 0) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        cf_ssl_scache_clear_peer((Curl_ssl_scache_peer *)(scache->peers->key_salt + lVar1 + -0x50));
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0xa8;
      } while (uVar2 < scache->peer_count);
    }
    (*Curl_cfree)(scache->peers);
    (*Curl_cfree)(scache);
    return;
  }
  return;
}

Assistant:

void Curl_ssl_scache_destroy(struct Curl_ssl_scache *scache)
{
  if(scache && GOOD_SCACHE(scache)) {
    size_t i;
    scache->magic = 0;
    for(i = 0; i < scache->peer_count; ++i) {
      cf_ssl_scache_clear_peer(&scache->peers[i]);
    }
    free(scache->peers);
    free(scache);
  }
}